

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

string * __thiscall
cppwinrt::get_field_abi_abi_cxx11_
          (string *__return_storage_ptr__,cppwinrt *this,writer *w,Field *field)

{
  database *this_00;
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  variant_alternative_t<1UL,_variant<ElementType,_coded_index<TypeDefOrRef>,_GenericTypeIndex,_GenericTypeInstSig,_GenericMethodTypeIndex>_>
  *pvVar4;
  long *plVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar6;
  char *field_00;
  table_base *ptVar7;
  database *pdVar8;
  bool bVar9;
  basic_string_view<char,_std::char_traits<char>_> __str;
  TypeDef TVar10;
  string_view sVar11;
  Field __begin2;
  FieldSig signature;
  undefined1 local_178 [32];
  pointer local_158;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [24];
  string local_118;
  undefined1 local_f8 [16];
  table_base *local_e8;
  uint32_t local_e0;
  FieldSig local_d8;
  
  winmd::reader::Field::Signature(&local_d8,(Field *)w);
  local_f8._0_8_ = (table_base *)0x1;
  local_f8._8_8_ = "%";
  local_130._16_8_ = this;
  writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
            (__return_storage_ptr__,(writer_base<cppwinrt::writer> *)this,(string_view *)local_f8,
             &local_d8.m_type);
  local_f8._8_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_f8._0_8_ = __return_storage_ptr__->_M_string_length;
  __str._M_str = "struct ";
  __str._M_len = 7;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_f8,0,7,__str);
  if (iVar1 == 0) {
    pvVar4 = std::
             get<1ul,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                       (&local_d8.m_type.m_type);
    ptVar7 = (pvVar4->super_typed_index<winmd::reader::TypeDefOrRef>).
             super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    uVar2 = (pvVar4->super_typed_index<winmd::reader::TypeDefOrRef>).
            super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    field_00 = "struct{";
    uVar3 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x18083f);
    if ((uVar2 & 3) == 0) {
      local_140._0_8_ = &ptVar7->m_database->TypeDef;
      uVar3 = (uVar2 >> 2) - 1;
    }
    else if ((uVar2 & 3) == 1) {
      local_178._24_8_ = ptVar7->m_database;
      local_158 = (pointer)CONCAT44(local_158._4_4_,(uVar2 >> 2) - 1);
      TVar10 = winmd::reader::find_required((TypeRef *)(local_178 + 0x18));
      local_140._0_8_ = TVar10.super_row_base<winmd::reader::TypeDef>.m_table;
      uVar3 = TVar10.super_row_base<winmd::reader::TypeDef>.m_index;
    }
    else {
      local_140._0_8_ = (table_base *)0x0;
    }
    local_140._8_4_ = uVar3;
    winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::Field>
              ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_f8,
               (row_base<winmd::reader::TypeDef> *)local_140,4);
    local_178._0_8_ = local_f8._0_8_;
    local_178._8_8_ = local_f8._8_8_;
    if (((table_base *)local_f8._0_8_ != local_e8) ||
       (local_178._8_4_ = (undefined4)local_f8._8_8_, bVar9 = local_178._8_4_ != local_e0, bVar9)) {
      do {
        get_field_abi_abi_cxx11_
                  (&local_118,(cppwinrt *)local_130._16_8_,(writer *)local_178,(Field *)field_00);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x1a9509);
        ptVar7 = (table_base *)(plVar5 + 2);
        if ((table_base *)*plVar5 == ptVar7) {
          local_130._0_8_ = ptVar7->m_database;
          local_130._8_8_ = plVar5[3];
          local_140._0_8_ = (table_base *)local_130;
        }
        else {
          local_130._0_8_ = ptVar7->m_database;
          local_140._0_8_ = (table_base *)*plVar5;
        }
        local_140._8_8_ = plVar5[1];
        *plVar5 = (long)ptVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_140);
        pdVar8 = (database *)(plVar5 + 2);
        if ((database *)*plVar5 == pdVar8) {
          local_150._0_8_ = (pdVar8->TypeRef).super_table_base.m_database;
          local_150._8_8_ = plVar5[3];
          local_178._24_8_ = (database *)local_150;
        }
        else {
          local_150._0_8_ = (pdVar8->TypeRef).super_table_base.m_database;
          local_178._24_8_ = (database *)*plVar5;
        }
        local_158 = (pointer)plVar5[1];
        *plVar5 = (long)pdVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_178._24_8_);
        if ((database *)local_178._24_8_ != (database *)local_150) {
          operator_delete((void *)local_178._24_8_,
                          (ulong)((long)&(((table<winmd::reader::TypeRef> *)local_150._0_8_)->
                                         super_table_base).m_database + 1));
        }
        if ((table_base *)local_140._0_8_ != (table_base *)local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)(local_130._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        this_00 = *(database **)local_178._0_8_;
        uVar2 = winmd::reader::table_base::get_value<unsigned_int>
                          ((table_base *)local_178._0_8_,local_178._8_4_,1);
        sVar11 = winmd::reader::database::get_string(this_00,uVar2);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)sVar11._M_str);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar3 = local_178._8_4_ + 1;
        local_178._8_4_ = uVar3;
        field_00 = (char *)CONCAT71((int7)((ulong)pdVar8 >> 8),
                                    (table_base *)local_178._0_8_ != local_e8);
      } while (uVar3 != local_e0 || (table_base *)local_178._0_8_ != local_e8);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_d8.m_type.m_array_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_type.m_array_sizes.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.m_type.m_array_sizes.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_type.m_array_sizes.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__detail::__variant::
  _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
  ::~_Variant_storage((_Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       *)&local_d8.m_type.m_type);
  psVar6 = extraout_RAX;
  if ((database *)
      local_d8.m_type.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_start != (database *)0x0) {
    operator_delete(local_d8.m_type.m_cmod.
                    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.m_type.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_type.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    psVar6 = extraout_RAX_00;
  }
  if (local_d8.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_cmod.
                    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    psVar6 = extraout_RAX_01;
  }
  return psVar6;
}

Assistant:

static std::string get_field_abi(writer& w, Field const& field)
    {
        auto signature = field.Signature();
        auto const& type = signature.Type();
        std::string name = w.write_temp("%", type);

        if (starts_with(name, "struct "))
        {
            auto ref = std::get<coded_index<TypeDefOrRef>>(type.Type());

            name = "struct{";

            for (auto&& nested : find_required(ref).FieldList())
            {
                name += " " + get_field_abi(w, nested) + " ";
                name += nested.Name();
                name += ";";
            }

            name += " }";
        }

        return name;
    }